

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspak.cpp
# Opt level: O2

void mmdupd_(int *ehead,int *neqns,int *xadj,int *adjncy,int *delta,int *mdeg,int *dhead,int *dforw,
            int *dbakw,int *qsize,int *llist,int *marker,int *maxint,int *tag)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  int *piVar22;
  long lVar23;
  uint local_48;
  uint local_40;
  int local_3c;
  int local_38;
  uint local_34;
  
  iVar1 = *delta;
  iVar2 = *mdeg;
LAB_00140785:
  iVar3 = *ehead;
  uVar12 = (ulong)iVar3;
  if ((long)uVar12 < 1) {
    return;
  }
  local_3c = *tag + iVar1 + iVar2;
  if (*maxint <= local_3c) {
    *tag = 1;
    uVar11 = (ulong)(uint)*neqns;
    if (*neqns < 1) {
      uVar11 = 0;
    }
    for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
      if (marker[uVar13] < *maxint) {
        marker[uVar13] = 0;
      }
    }
    local_3c = *tag + iVar1 + iVar2;
  }
  local_38 = 0;
  local_40 = 0;
  uVar17 = 0;
  local_34 = 0;
  uVar11 = uVar12;
  uVar18 = 0;
  do {
    lVar14 = (long)xadj[(long)(int)uVar11 + -1];
    iVar15 = xadj[(int)uVar11];
    local_48 = local_34;
    uVar21 = uVar18;
    while( true ) {
      if (iVar15 <= lVar14) goto LAB_001409f0;
      uVar4 = adjncy[lVar14 + -1];
      lVar16 = (long)(int)uVar4;
      if (lVar16 < 0) break;
      if (uVar4 == 0) goto LAB_001409f0;
      if (qsize[lVar16 + -1] != 0) {
        local_38 = local_38 + qsize[lVar16 + -1];
        marker[lVar16 + -1] = local_3c;
        if (dbakw[lVar16 + -1] == 0) {
          uVar20 = uVar18;
          if (dforw[lVar16 + -1] == 2) {
            uVar20 = local_48;
          }
          piVar22 = &mmdupd_::qxhead;
          uVar19 = uVar4;
          uVar8 = uVar4;
          uVar9 = uVar4;
          if (dforw[lVar16 + -1] == 2) {
            piVar22 = &mmdupd_::q2head;
            uVar19 = uVar18;
            local_34 = uVar4;
            uVar8 = local_40;
            uVar17 = uVar4;
            uVar9 = uVar21;
            local_48 = uVar4;
          }
          uVar21 = uVar9;
          local_40 = uVar8;
          llist[lVar16 + -1] = uVar20;
          *piVar22 = uVar4;
          uVar18 = uVar19;
        }
      }
      lVar14 = lVar14 + 1;
    }
    uVar11 = (ulong)-uVar4;
    uVar18 = uVar21;
  } while( true );
LAB_001409f0:
  uVar18 = local_40;
  if ((int)uVar17 < 1) goto LAB_00140b11;
  uVar11 = (ulong)uVar17;
  bVar7 = true;
  if (dbakw[uVar11 - 1] != 0) goto LAB_001409d9;
  *tag = *tag + 1;
  iVar15 = adjncy[(long)xadj[uVar11 - 1] + -1];
  if (iVar15 == iVar3) {
    iVar15 = adjncy[xadj[uVar11 - 1]];
  }
  if (dforw[(long)iVar15 + -1] < 0) {
    iVar10 = local_38;
LAB_00140a4e:
    lVar14 = (long)xadj[(long)iVar15 + -1];
    iVar15 = xadj[iVar15];
    do {
      bVar7 = true;
      if (iVar15 <= lVar14) goto LAB_0014096c;
      uVar18 = adjncy[lVar14 + -1];
      uVar13 = (ulong)uVar18;
      if (uVar18 != uVar17) {
        if ((int)uVar18 < 0) goto LAB_00140b00;
        if (uVar13 == 0) goto LAB_0014096c;
        if (qsize[uVar13 - 1] != 0) {
          if (marker[uVar13 - 1] < *tag) {
            marker[uVar13 - 1] = *tag;
            iVar10 = iVar10 + qsize[uVar13 - 1];
          }
          else if (dbakw[uVar13 - 1] == 0) {
            if (dforw[uVar13 - 1] == 2) {
              qsize[uVar11 - 1] = qsize[uVar11 - 1] + qsize[uVar13 - 1];
              qsize[uVar13 - 1] = 0;
              marker[uVar13 - 1] = *maxint;
              dforw[uVar13 - 1] = -uVar17;
            }
            dbakw[uVar13 - 1] = -*maxint;
          }
        }
      }
      lVar14 = lVar14 + 1;
    } while( true );
  }
  iVar10 = qsize[(long)iVar15 + -1] + local_38;
  bVar7 = true;
LAB_0014096c:
  do {
    lVar14 = (long)iVar10 - (long)qsize[uVar11 - 1];
    iVar10 = (uint)lVar14 + 1;
    iVar15 = dhead[lVar14];
    dforw[uVar11 - 1] = iVar15;
    dbakw[uVar11 - 1] = ~(uint)lVar14;
    if (0 < (long)iVar15) {
      dbakw[(long)iVar15 + -1] = uVar17;
    }
    dhead[lVar14] = uVar17;
    if (*mdeg <= iVar10) goto LAB_001409d9;
    *mdeg = iVar10;
    uVar17 = llist[(ulong)uVar17 - 1];
    uVar18 = uVar17;
    if (bVar7) goto LAB_001409f0;
LAB_00140b11:
    while( true ) {
      uVar17 = uVar18;
      if ((int)uVar17 < 1) {
        *tag = local_3c;
        ehead = llist + (uVar12 - 1);
        goto LAB_00140785;
      }
      uVar11 = (ulong)uVar17;
      if (dbakw[uVar11 - 1] == 0) break;
      bVar7 = false;
LAB_001409d9:
      uVar17 = llist[(long)(int)uVar17 + -1];
      uVar18 = uVar17;
      if (bVar7) goto LAB_001409f0;
    }
    *tag = *tag + 1;
    lVar14 = (long)xadj[uVar11 - 1];
    iVar15 = xadj[uVar11];
    iVar10 = local_38;
    while ((lVar14 < iVar15 && (uVar13 = (ulong)adjncy[lVar14 + -1], uVar13 != 0))) {
      if (marker[uVar13 - 1] < *tag) {
        marker[uVar13 - 1] = *tag;
        if (dforw[uVar13 - 1] < 0) {
          do {
            lVar16 = (long)xadj[(long)(int)uVar13 + -1];
            iVar5 = xadj[(int)uVar13];
            while( true ) {
              if (iVar5 <= lVar16) goto LAB_00140961;
              iVar6 = adjncy[lVar16 + -1];
              lVar23 = (long)iVar6;
              if (lVar23 < 0) break;
              if (iVar6 == 0) goto LAB_00140961;
              if (marker[lVar23 + -1] < *tag) {
                marker[lVar23 + -1] = *tag;
                iVar10 = iVar10 + qsize[lVar23 + -1];
              }
              lVar16 = lVar16 + 1;
            }
            uVar13 = (ulong)(uint)-iVar6;
          } while( true );
        }
        iVar10 = iVar10 + qsize[uVar13 - 1];
      }
LAB_00140961:
      lVar14 = lVar14 + 1;
    }
    bVar7 = false;
  } while( true );
LAB_00140b00:
  iVar15 = -uVar18;
  goto LAB_00140a4e;
}

Assistant:

void mmdupd_(int* ehead, int* neqns, int* xadj, int* adjncy, int* delta,
            int* mdeg, int* dhead, int* dforw, int* dbakw, int* qsize,
            int* llist, int* marker, int* maxint, int* tag)
{
    /* System generated locals */
    int i__1, i__2;

    /* Local variables */
    static int node, mtag, link, mdeg0, i, j, enode, fnode, nabor, elmnt,
            istop, jstop, q2head, istrt, jstrt, qxhead, iq2, deg, deg0;


/* *************************************************************** */

/*         INTEGER*2  ADJNCY(1), DBAKW(1) , DFORW(1) , DHEAD(1) , */
/*     1              LLIST(1) , MARKER(1), QSIZE(1) */

/* *************************************************************** */

    /* Parameter adjustments */
    --marker; --llist; --qsize; --dbakw; --dforw; --dhead;
    --adjncy; --xadj;

    /* Function Body */
    mdeg0 = *mdeg + *delta;
    elmnt = *ehead;
L100:
/*            ------------------------------------------------------- */
/*            FOR EACH OF THE NEWLY FORMED ELEMENT, DO THE FOLLOWING. */
/*            (RESET TAG VALUE IF NECESSARY.) */
/*            ------------------------------------------------------- */
    if (elmnt <= 0) {
        return;
    }
    mtag = *tag + mdeg0;
    if (mtag < *maxint) {
        goto L300;
    }
    *tag = 1;
    i__1 = *neqns;
    for (i = 1; i <= i__1; ++i) {
        if (marker[i] < *maxint) {
            marker[i] = 0;
        }
/* L200: */
    }
    mtag = *tag + mdeg0;
L300:
/*            --------------------------------------------- */
/*            CREATE TWO LINKED LISTS FROM NODES ASSOCIATED */
/*            WITH ELMNT: ONE WITH TWO NABORS (Q2HEAD) IN */
/*            ADJACENCY STRUCTURE, AND THE OTHER WITH MORE */
/*            THAN TWO NABORS (QXHEAD).  ALSO COMPUTE DEG0, */
/*            NUMBER OF NODES IN THIS ELEMENT. */
/*            --------------------------------------------- */
    q2head = 0;
    qxhead = 0;
    deg0 = 0;
    link = elmnt;
L400:
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        enode = adjncy[i];
        link = -enode;
        if (enode < 0) {
            goto L400;
        } else if (enode == 0) {
            goto L800;
        } else {
            goto L500;
        }

L500:
        if (qsize[enode] == 0) {
            goto L700;
        }
        deg0 += qsize[enode];
        marker[enode] = mtag;
/*                        ---------------------------------- */
/*                        IF ENODE REQUIRES A DEGREE UPDATE, */
/*                        THEN DO THE FOLLOWING. */
/*                        ---------------------------------- */
        if (dbakw[enode] != 0) {
            goto L700;
        }
/*                            ---------------------------------------
*/
/*                            PLACE EITHER IN QXHEAD OR Q2HEAD LISTS.
*/
/*                            ---------------------------------------
*/
        if (dforw[enode] == 2) {
            goto L600;
        }
        llist[enode] = qxhead;
        qxhead = enode;
        goto L700;
L600:
        llist[enode] = q2head;
        q2head = enode;
L700:
        ;
    }
L800:
/*            -------------------------------------------- */
/*            FOR EACH ENODE IN Q2 LIST, DO THE FOLLOWING. */
/*            -------------------------------------------- */
    enode = q2head;
    iq2 = 1;
L900:
    if (enode <= 0) {
        goto L1500;
    }
    if (dbakw[enode] != 0) {
        goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                    ------------------------------------------ */
/*                    IDENTIFY THE OTHER ADJACENT ELEMENT NABOR. */
/*                    ------------------------------------------ */
    istrt = xadj[enode];
    nabor = adjncy[istrt];
    if (nabor == elmnt) {
        nabor = adjncy[istrt + 1];
    }
/*                    ------------------------------------------------ */
/*                    IF NABOR IS UNELIMINATED, INCREASE DEGREE COUNT. */
/*                    ------------------------------------------------ */
    link = nabor;
    if (dforw[nabor] < 0) {
        goto L1000;
    }
    deg += qsize[nabor];
    goto L2100;
L1000:
/*                        -------------------------------------------- */
/*                        OTHERWISE, FOR EACH NODE IN THE 2ND ELEMENT, */
/*                        DO THE FOLLOWING. */
/*                        -------------------------------------------- */
    istrt = xadj[link];
    istop = xadj[link + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        node = adjncy[i];
        link = -node;
        if (node == enode) {
            goto L1400;
        }
        if (node < 0) {
            goto L1000;
        } else if (node == 0) {
            goto L2100;
        } else {
            goto L1100;
        }

L1100:
        if (qsize[node] == 0) {
            goto L1400;
        }
        if (marker[node] >= *tag) {
            goto L1200;
        }
/*                                -----------------------------------
-- */
/*                                CASE WHEN NODE IS NOT YET CONSIDERED
. */
/*                                -----------------------------------
-- */
        marker[node] = *tag;
        deg += qsize[node];
        goto L1400;
L1200:
/*                            ----------------------------------------
 */
/*                            CASE WHEN NODE IS INDISTINGUISHABLE FROM
 */
/*                            ENODE.  MERGE THEM INTO A NEW SUPERNODE.
 */
/*                            ----------------------------------------
 */
        if (dbakw[node] != 0) {
            goto L1400;
        }
        if (dforw[node] != 2) {
            goto L1300;
        }
        qsize[enode] += qsize[node];
        qsize[node] = 0;
        marker[node] = *maxint;
        dforw[node] = -enode;
        dbakw[node] = -(*maxint);
        goto L1400;
L1300:
/*                            --------------------------------------
*/
/*                            CASE WHEN NODE IS OUTMATCHED BY ENODE.
*/
/*                            --------------------------------------
*/
        if (dbakw[node] == 0) {
            dbakw[node] = -(*maxint);
        }
L1400:
        ;
    }
    goto L2100;
L1500:
/*                ------------------------------------------------ */
/*                FOR EACH ENODE IN THE QX LIST, DO THE FOLLOWING. */
/*                ------------------------------------------------ */
    enode = qxhead;
    iq2 = 0;
L1600:
    if (enode <= 0) {
        goto L2300;
    }
    if (dbakw[enode] != 0) {
        goto L2200;
    }
    ++(*tag);
    deg = deg0;
/*                        --------------------------------- */
/*                        FOR EACH UNMARKED NABOR OF ENODE, */
/*                        DO THE FOLLOWING. */
/*                        --------------------------------- */
    istrt = xadj[enode];
    istop = xadj[enode + 1] - 1;
    i__1 = istop;
    for (i = istrt; i <= i__1; ++i) {
        nabor = adjncy[i];
        if (nabor == 0) {
            goto L2100;
        }
        if (marker[nabor] >= *tag) {
            goto L2000;
        }
        marker[nabor] = *tag;
        link = nabor;
/*                                ------------------------------ */
/*                                IF UNELIMINATED, INCLUDE IT IN */
/*                                DEG COUNT. */
/*                                ------------------------------ */
        if (dforw[nabor] < 0) {
            goto L1700;
        }
        deg += qsize[nabor];
        goto L2000;
L1700:
/*                                    -------------------------------
*/
/*                                    IF ELIMINATED, INCLUDE UNMARKED
*/
/*                                    NODES IN THIS ELEMENT INTO THE
*/
/*                                    DEGREE COUNT. */
/*                                    -------------------------------
*/
        jstrt = xadj[link];
        jstop = xadj[link + 1] - 1;
        i__2 = jstop;
        for (j = jstrt; j <= i__2; ++j) {
            node = adjncy[j];
            link = -node;
            if (node < 0) {
                goto L1700;
            } else if (node == 0) {
                goto L2000;
            } else {
                goto L1800;
            }

L1800:
            if (marker[node] >= *tag) {
                goto L1900;
            }
            marker[node] = *tag;
            deg += qsize[node];
L1900:
            ;
        }
L2000:
        ;
    }
L2100:
/*                    ------------------------------------------- */
/*                    UPDATE EXTERNAL DEGREE OF ENODE IN DEGREE */
/*                    STRUCTURE, AND MDEG (MIN DEG) IF NECESSARY. */
/*                    ------------------------------------------- */
    deg = deg - qsize[enode] + 1;
    fnode = dhead[deg];
    dforw[enode] = fnode;
    dbakw[enode] = -deg;
    if (fnode > 0) {
        dbakw[fnode] = enode;
    }
    dhead[deg] = enode;
    if (deg < *mdeg) {
        *mdeg = deg;
    }
L2200:
/*                    ---------------------------------- */
/*                    GET NEXT ENODE IN CURRENT ELEMENT. */
/*                    ---------------------------------- */
    enode = llist[enode];
    if (iq2 == 1) {
        goto L900;
    }
    goto L1600;
L2300:
/*            ----------------------------- */
/*            GET NEXT ELEMENT IN THE LIST. */
/*            ----------------------------- */
    *tag = mtag;
    elmnt = llist[elmnt];
    goto L100;

}